

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrVertexAttrib.cpp
# Opt level: O0

void rr::anon_unknown_1::readHalf(Vec4 *dst,int size,void *ptr)

{
  float *pfVar1;
  float fVar2;
  Float<unsigned_short,_5,_10,_15,_3U> local_30;
  Float<unsigned_short,_5,_10,_15,_3U> local_2e;
  Float<unsigned_short,_5,_10,_15,_3U> local_2c;
  Float<unsigned_short,_5,_10,_15,_3U> local_2a;
  StorageType_conflict local_28;
  StorageType_conflict local_26;
  StorageType_conflict local_24;
  StorageType_conflict local_22;
  deUint16 aligned [4];
  void *ptr_local;
  int size_local;
  Vec4 *dst_local;
  
  aligned = (deUint16  [4])ptr;
  ::deMemcpy(&local_28,ptr,(long)size << 1);
  tcu::Float<unsigned_short,_5,_10,_15,_3U>::Float(&local_2a,local_28);
  fVar2 = tcu::Float<unsigned_short,_5,_10,_15,_3U>::asFloat(&local_2a);
  pfVar1 = tcu::Vector<float,_4>::operator[](dst,0);
  *pfVar1 = fVar2;
  if (1 < size) {
    tcu::Float<unsigned_short,_5,_10,_15,_3U>::Float(&local_2c,local_26);
    fVar2 = tcu::Float<unsigned_short,_5,_10,_15,_3U>::asFloat(&local_2c);
    pfVar1 = tcu::Vector<float,_4>::operator[](dst,1);
    *pfVar1 = fVar2;
  }
  if (2 < size) {
    tcu::Float<unsigned_short,_5,_10,_15,_3U>::Float(&local_2e,local_24);
    fVar2 = tcu::Float<unsigned_short,_5,_10,_15,_3U>::asFloat(&local_2e);
    pfVar1 = tcu::Vector<float,_4>::operator[](dst,2);
    *pfVar1 = fVar2;
  }
  if (3 < size) {
    tcu::Float<unsigned_short,_5,_10,_15,_3U>::Float(&local_30,local_22);
    fVar2 = tcu::Float<unsigned_short,_5,_10,_15,_3U>::asFloat(&local_30);
    pfVar1 = tcu::Vector<float,_4>::operator[](dst,3);
    *pfVar1 = fVar2;
  }
  return;
}

Assistant:

inline void readHalf (tcu::Vec4& dst, const int size, const void* ptr)
{
	deUint16 aligned[4];
	deMemcpy(aligned, ptr, size * sizeof(deUint16));

				   dst[0] = tcu::Float16(aligned[0]).asFloat();
	if (size >= 2) dst[1] = tcu::Float16(aligned[1]).asFloat();
	if (size >= 3) dst[2] = tcu::Float16(aligned[2]).asFloat();
	if (size >= 4) dst[3] = tcu::Float16(aligned[3]).asFloat();
}